

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

vec4 dja::normalize(vec4 *a)

{
  float_t b;
  vec4 vVar1;
  
  b = norm(a);
  vVar1 = operator/(a,b);
  return vVar1;
}

Assistant:

V4 normalize(const V4& a) {return a / norm(a);}